

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr_guardedTests.cpp
# Opt level: O1

void __thiscall
lr_guarded_lr_guarded_2_Test::~lr_guarded_lr_guarded_2_Test(lr_guarded_lr_guarded_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lr_guarded, lr_guarded_2)
{
    lr_guarded<int> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 100000; ++i) {
            data.modify([](int& value) { ++value; });
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 100000; ++i) {
            data.modify([](int& value) { ++value; });
        }
    });

    std::thread th3([&data]() {
        int last_val = 0;
        while (last_val != 200000) {
            auto data_handle = data.lock_shared();
            EXPECT_TRUE(last_val <= *data_handle);
            last_val = *data_handle;
        }
    });

    th1.join();
    th2.join();
    th3.join();

    auto data_handle = data.lock_shared();

    EXPECT_EQ(*data_handle, 200000);
}